

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void __thiscall vsencoding::BitsWriter::bit_flush(BitsWriter *this)

{
  uint32_t *puVar1;
  BitsWriter *this_local;
  
  if (this->Fill != 0) {
    if (0x20 < this->Fill) {
      this->buffer = this->buffer << (0x40U - (char)this->Fill & 0x3f);
      puVar1 = this->data;
      this->data = puVar1 + 1;
      *puVar1 = (uint32_t)(this->buffer >> 0x20);
      puVar1 = this->data;
      this->data = puVar1 + 1;
      *puVar1 = (uint32_t)this->buffer;
      this->written = this->written + 2;
      this->Fill = 0;
    }
    if (this->Fill != 0) {
      puVar1 = this->data;
      this->data = puVar1 + 1;
      *puVar1 = (uint32_t)(this->buffer << (0x20U - (char)this->Fill & 0x3f));
      this->written = this->written + 1;
    }
    this->buffer = 0;
    this->Fill = 0;
  }
  return;
}

Assistant:

inline void BitsWriter::bit_flush() {
  if (Fill == 0)
    return;

  if (Fill > 32) {
    buffer <<= 64 - Fill;
    *data++ = static_cast<uint32_t>(buffer >> 32);
    *data++ = buffer & ((1ULL << 32) - 1);
    written += 2;
    Fill = 0;
  }

  if (Fill > 0) {
    *data++ = buffer << (32 - Fill) & ((1ULL << 32) - 1);
    written++;
  }

  buffer = 0;
  Fill = 0;
}